

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::Phase<std::complex<float>_>::update
          (Phase<std::complex<float>_> *this,angle_type *angle)

{
  int iVar1;
  angle_type *angle_local;
  Phase<std::complex<float>_> *this_local;
  
  iVar1 = (*(this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[1])();
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!fixed()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/Phase.hpp"
                  ,0xb2,
                  "void qclab::qgates::Phase<std::complex<float>>::update(const angle_type &) [T = std::complex<float>]"
                 );
  }
  QAngle<float>::update(&this->angle_,angle);
  return;
}

Assistant:

void update( const angle_type& angle ) {
          assert( !fixed() ) ;
          angle_.update( angle ) ;
        }